

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O0

void dyn_tbl_print(dyn_tbl_t *dyn_tbl,char *output)

{
  FILE *__stream;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  pointer ppVar4;
  char *in_RSI;
  long in_RDI;
  uint *ptr_1;
  char addr2 [30];
  char addr1_1 [30];
  uint *ptr;
  char addr1 [30];
  dyn_tbl_key_t key;
  iterator it;
  uint len;
  FILE *fp;
  FILE *in_stack_ffffffffffffff18;
  _Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true> *in_stack_ffffffffffffff20;
  uint32_t ip;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_30;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_28;
  undefined4 local_1c;
  FILE *local_18;
  char *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = fopen(in_RSI,"w");
  if (local_18 == (FILE *)0x0) {
    fprintf(_stderr,"ERR: cannot open %s\n",local_10);
    exit(-1);
  }
  sVar2 = std::
          unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
          ::size((unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                  *)0x103d10);
  local_1c = (undefined4)sVar2;
  fprintf(local_18,"length: %u\n",sVar2 & 0xffffffff);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::begin((unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                *)in_stack_ffffffffffffff18);
  while( true ) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
         ::end((unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                *)in_stack_ffffffffffffff18);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::
    operator->((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true> *)0x103d89);
    __stream = local_18;
    ip = (uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    if (*(int *)(local_8 + 0x58) == 0x20) {
      pcVar3 = ip2a(ip,(char *)in_stack_ffffffffffffff18);
      ppVar4 = std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)0x103df6);
      fprintf(__stream,"%s %lld\n",pcVar3,ppVar4->second);
    }
    else {
      in_stack_ffffffffffffff18 = local_18;
      in_stack_ffffffffffffff20 =
           (_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true> *)
           ip2a(ip,(char *)local_18);
      pcVar3 = ip2a((uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                    (char *)in_stack_ffffffffffffff18);
      ppVar4 = std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)0x103e67);
      fprintf(in_stack_ffffffffffffff18,"%s %s %lld\n",in_stack_ffffffffffffff20,pcVar3,
              ppVar4->second);
    }
    std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::
    operator++(in_stack_ffffffffffffff20);
  }
  fclose(local_18);
  return;
}

Assistant:

void dyn_tbl_print(dyn_tbl_t* dyn_tbl, const char* output) {
	FILE* fp;

	// open a file
	if ((fp = fopen(output, "w")) == NULL) {
		fprintf(stderr, "ERR: cannot open %s\n", output);
		exit(-1);
	}

	unsigned int len = dyn_tbl->array.size();
	fprintf(fp, "length: %u\n", len);
	// for(std::unordered_map<dyn_tbl_key_t, long long>::iterator it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
	for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
		dyn_tbl_key_t key = it->first;
		if (dyn_tbl->lgn == 32) {
			char addr1[30];
			unsigned int* ptr = (unsigned int*)key.key;
			fprintf(fp, "%s %lld\n", ip2a(*ptr, addr1), it->second);
		}
		else {
			char addr1[30];
			char addr2[30];
			unsigned int* ptr = (unsigned int*)key.key;
			fprintf(fp, "%s %s %lld\n", ip2a(*ptr, addr1), ip2a(*(ptr + 1), addr2), it->second);
		}
	}

	// close the file
	fclose(fp);
}